

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void av1_lowbd_fwd_txfm2d_8x32_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  transform_1d_sse2 p_Var3;
  transform_1d_sse2 p_Var4;
  int8_t *piVar5;
  int iVar6;
  int iVar7;
  byte in_CL;
  __m128i *buf;
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_sse2 row_txfm;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [32];
  __m128i buf0 [32];
  int in_stack_fffffffffffffb8c;
  __m128i *in_stack_fffffffffffffb90;
  __m128i *out;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  uint in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  longlong local_428 [5];
  __m128i *in_stack_fffffffffffffc00;
  __m128i *in_stack_fffffffffffffc08;
  longlong local_228 [66];
  byte local_15;
  
  piVar5 = av1_fwd_txfm_shift_ls[0xf];
  local_15 = in_CL;
  iVar6 = get_txw_idx('\x0f');
  iVar7 = get_txh_idx('\x0f');
  iVar1 = av1_fwd_cos_bit_col[iVar6][iVar7];
  iVar2 = av1_fwd_cos_bit_row[iVar6][iVar7];
  p_Var3 = col_txfm8x32_arr[local_15];
  p_Var4 = row_txfm8x8_arr[local_15];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffba4,(int *)&stack0xfffffffffffffba0);
  if (in_stack_fffffffffffffba4 == 0) {
    load_buffer_16bit_to_16bit
              ((int16_t *)(ulong)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
  }
  else {
    load_buffer_16bit_to_16bit_flip
              ((int16_t *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
  }
  round_shift_16bit((__m128i *)local_228,0x20,(int)*piVar5);
  (*p_Var3)((__m128i *)local_228,(__m128i *)local_228,iVar1);
  round_shift_16bit((__m128i *)local_228,0x20,(int)piVar5[1]);
  transpose_16bit_8x8(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  transpose_16bit_8x8(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  transpose_16bit_8x8(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  transpose_16bit_8x8(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
    if (in_stack_fffffffffffffba0 == 0) {
      out = (__m128i *)(local_428 + (long)(iVar6 << 3) * 2);
    }
    else {
      out = (__m128i *)local_228;
      flip_buf_sse2((__m128i *)(local_428 + (long)(iVar6 << 3) * 2),out,8);
    }
    (*p_Var4)(out,out,iVar2);
    round_shift_16bit(out,8,(int)piVar5[2]);
    store_buffer_16bit_to_32bit_w8
              ((__m128i *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (int32_t *)CONCAT44(iVar6,in_stack_fffffffffffffb98),(int)((ulong)out >> 0x20),
               (int)out);
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x32_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X32];
  const int txw_idx = get_txw_idx(TX_8X32);
  const int txh_idx = get_txh_idx(TX_8X32);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 32;
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);
  transpose_16bit_8x8(buf0 + 16, buf1 + 16);
  transpose_16bit_8x8(buf0 + 24, buf1 + 24);

  for (int i = 0; i < 4; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}